

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantPool.cc
# Opt level: O0

void __thiscall flow::ConstantPool::dump(ConstantPool *this)

{
  uint64_t uVar1;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  const_reference pvVar7;
  const_reference this_00;
  const_reference this_01;
  const_reference pvVar8;
  char *pcVar9;
  ostream *poVar10;
  const_reference pvVar11;
  size_type sVar12;
  const_reference pvVar13;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *this_02;
  unsigned_long *puVar14;
  size_t sVar15;
  MatchClass mc;
  allocator<char> local_1d1;
  string local_1d0;
  string local_1b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_190;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *handler;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *__range1;
  MatchCaseDef *one;
  size_t m_1;
  size_t k_1;
  const_reference local_128;
  MatchDef *def;
  size_t e_9;
  size_t i_9;
  size_t m;
  size_t k;
  const_reference local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *array;
  size_t e_8;
  size_t i_8;
  size_t e_7;
  size_t i_7;
  size_type local_b0;
  size_t e_6;
  size_t i_6;
  string local_90;
  size_type local_70;
  size_t e_5;
  size_t i_5;
  size_t e_4;
  size_t i_4;
  size_t e_3;
  size_t i_3;
  size_t e_2;
  size_t i_2;
  size_t e_1;
  size_t i_1;
  size_t e;
  size_t i;
  ConstantPool *this_local;
  
  i = (size_t)this;
  printf("; Program\n");
  bVar3 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->modules_);
  if (!bVar3) {
    printf("\n; Modules\n");
    e = 0;
    i_1 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(&this->modules_);
    for (; e != i_1; e = e + 1) {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&this->modules_,e);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&this->modules_,e);
        uVar5 = std::__cxx11::string::c_str();
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&this->modules_,e);
        uVar6 = std::__cxx11::string::c_str();
        printf(".module \'%s\' from \'%s\'\n",uVar5,uVar6);
      }
      else {
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&this->modules_,e);
        uVar5 = std::__cxx11::string::c_str();
        printf(".module \'%s\'\n",uVar5);
      }
    }
  }
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->nativeFunctionSignatures_);
  if (!bVar3) {
    printf("\n; External Functions\n");
    e_1 = 0;
    i_2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->nativeFunctionSignatures_);
    for (; sVar15 = e_1, e_1 != i_2; e_1 = e_1 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->nativeFunctionSignatures_,e_1);
      uVar5 = std::__cxx11::string::c_str();
      printf(".extern function %3zu = %-20s\n",sVar15,uVar5);
    }
  }
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->nativeHandlerSignatures_);
  if (!bVar3) {
    printf("\n; External Handlers\n");
    e_2 = 0;
    i_3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->nativeHandlerSignatures_);
    for (; sVar15 = e_2, e_2 != i_3; e_2 = e_2 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->nativeHandlerSignatures_,e_2);
      uVar5 = std::__cxx11::string::c_str();
      printf(".extern handler %4zu = %-20s\n",sVar15,uVar5);
    }
  }
  bVar3 = std::vector<long,_std::allocator<long>_>::empty(&this->numbers_);
  if (!bVar3) {
    printf("\n; Integer Constants\n");
    e_3 = 0;
    i_4 = std::vector<long,_std::allocator<long>_>::size(&this->numbers_);
    for (; sVar15 = e_3, e_3 != i_4; e_3 = e_3 + 1) {
      pvVar7 = std::vector<long,_std::allocator<long>_>::operator[](&this->numbers_,e_3);
      printf(".const integer %5zu = %li\n",sVar15,*pvVar7);
    }
  }
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->strings_);
  if (!bVar3) {
    printf("\n; String Constants\n");
    e_4 = 0;
    i_5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->strings_);
    for (; sVar15 = e_4, e_4 != i_5; e_4 = e_4 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->strings_,e_4);
      uVar5 = std::__cxx11::string::c_str();
      printf(".const string %6zu = \'%s\'\n",sVar15,uVar5);
    }
  }
  bVar3 = std::vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>::empty
                    (&this->ipaddrs_);
  if (!bVar3) {
    printf("\n; IP Constants\n");
    e_5 = 0;
    local_70 = std::vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>::size
                         (&this->ipaddrs_);
    for (; sVar15 = e_5, e_5 != local_70; e_5 = e_5 + 1) {
      this_00 = std::vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>::
                operator[](&this->ipaddrs_,e_5);
      util::IPAddress::str_abi_cxx11_(&local_90,this_00);
      uVar5 = std::__cxx11::string::c_str();
      printf(".const ipaddr %6zu = %s\n",sVar15,uVar5);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  bVar3 = std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>::empty(&this->cidrs_);
  if (!bVar3) {
    printf("\n; CIDR Constants\n");
    e_6 = 0;
    local_b0 = std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>::size(&this->cidrs_)
    ;
    for (; sVar15 = e_6, e_6 != local_b0; e_6 = e_6 + 1) {
      this_01 = std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>::operator[]
                          (&this->cidrs_,e_6);
      util::Cidr::str_abi_cxx11_((string *)&i_7,this_01);
      uVar5 = std::__cxx11::string::c_str();
      printf(".const cidr %8zu = %s\n",sVar15,uVar5);
      std::__cxx11::string::~string((string *)&i_7);
    }
  }
  bVar3 = std::vector<flow::util::RegExp,_std::allocator<flow::util::RegExp>_>::empty
                    (&this->regularExpressions_);
  if (!bVar3) {
    printf("\n; Regular Expression Constants\n");
    e_7 = 0;
    i_8 = std::vector<flow::util::RegExp,_std::allocator<flow::util::RegExp>_>::size
                    (&this->regularExpressions_);
    for (; sVar15 = e_7, e_7 != i_8; e_7 = e_7 + 1) {
      pvVar8 = std::vector<flow::util::RegExp,_std::allocator<flow::util::RegExp>_>::operator[]
                         (&this->regularExpressions_,e_7);
      pcVar9 = util::RegExp::c_str(pvVar8);
      printf(".const regex %7zu = /%s/\n",sVar15,pcVar9);
    }
  }
  bVar3 = std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::empty(&this->stringArrays_);
  if (!bVar3) {
    std::operator<<((ostream *)&std::cout,"\n; Constant String Arrays\n");
    e_8 = 0;
    array = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::size(&this->stringArrays_);
    for (; (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)e_8 != array; e_8 = e_8 + 1) {
      local_f8 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&this->stringArrays_,e_8);
      poVar10 = std::operator<<((ostream *)&std::cout,".const array<string> ");
      k._4_4_ = std::setw(3);
      poVar10 = std::operator<<(poVar10,k._4_4_);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,e_8);
      std::operator<<(poVar10," = [");
      m = 0;
      i_9 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_f8);
      for (; m != i_9; m = m + 1) {
        if (m != 0) {
          std::operator<<((ostream *)&std::cout,", ");
        }
        poVar10 = std::operator<<((ostream *)&std::cout,'\"');
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](local_f8,m);
        poVar10 = std::operator<<(poVar10,(string *)pvVar11);
        std::operator<<(poVar10,'\"');
      }
      std::operator<<((ostream *)&std::cout,"];\n");
    }
  }
  dumpArrays<long>(&this->intArrays_,"Integer");
  dumpArrays<flow::util::IPAddress>(&this->ipaddrArrays_,"IPAddress");
  dumpArrays<flow::util::Cidr>(&this->cidrArrays_,"Cidr");
  bVar3 = std::vector<flow::MatchDef,_std::allocator<flow::MatchDef>_>::empty(&this->matchDefs_);
  if (!bVar3) {
    printf("\n; Match Table\n");
    e_9 = 0;
    def = (MatchDef *)
          std::vector<flow::MatchDef,_std::allocator<flow::MatchDef>_>::size(&this->matchDefs_);
    for (; (MatchDef *)e_9 != def; e_9 = e_9 + 1) {
      local_128 = std::vector<flow::MatchDef,_std::allocator<flow::MatchDef>_>::operator[]
                            (&this->matchDefs_,e_9);
      sVar2 = e_9;
      sVar15 = local_128->handlerId;
      tos_abi_cxx11_((string *)&k_1,(flow *)(ulong)local_128->op,mc);
      uVar5 = std::__cxx11::string::c_str();
      uVar1 = local_128->elsePC;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::operator[](&this->handlers_,local_128->handlerId);
      uVar6 = std::__cxx11::string::c_str();
      printf(".const match %7zu = handler %zu, op %s, elsePC %lu ; %s\n",sVar2,sVar15,uVar5,uVar1,
             uVar6);
      std::__cxx11::string::~string((string *)&k_1);
      m_1 = 0;
      sVar12 = std::vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>::size
                         (&local_128->cases);
      for (; m_1 != sVar12; m_1 = m_1 + 1) {
        pvVar13 = std::vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>::operator[]
                            (&local_128->cases,m_1);
        printf("                       case %3zu = label %2lu, pc %4lu ; ",m_1,pvVar13->label,
               pvVar13->pc);
        if (local_128->op == RegExp) {
          pvVar8 = std::vector<flow::util::RegExp,_std::allocator<flow::util::RegExp>_>::operator[]
                             (&this->regularExpressions_,pvVar13->label);
          pcVar9 = util::RegExp::c_str(pvVar8);
          printf("/%s/\n",pcVar9);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&this->strings_,pvVar13->label);
          uVar5 = std::__cxx11::string::c_str();
          printf("\'%s\'\n",uVar5);
        }
      }
    }
  }
  this_02 = getHandlers_abi_cxx11_(this);
  __end1 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::begin(this_02);
  handler = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             *)std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::end(this_02);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                     *)&handler), bVar3) {
    code = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           __gnu_cxx::
           __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ::operator*(&__end1);
    local_190 = &((reference)code)->second;
    name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)code;
    uVar5 = std::__cxx11::string::c_str();
    puVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data(local_190);
    sVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_190);
    sVar15 = computeStackSize(puVar14,sVar12);
    sVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_190);
    printf("\n.handler %-27s ; (%zu stack size, %zu instructions)\n",uVar5,sVar15,sVar12);
    puVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data(local_190);
    sVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_190);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"  ",&local_1d1);
    disassemble(&local_1b0,puVar14,sVar12,&local_1d0,this);
    uVar5 = std::__cxx11::string::c_str();
    printf("%s",uVar5);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::operator++(&__end1);
  }
  printf("\n\n");
  return;
}

Assistant:

void ConstantPool::dump() const {
  printf("; Program\n");

  if (!modules_.empty()) {
    printf("\n; Modules\n");
    for (size_t i = 0, e = modules_.size(); i != e; ++i) {
      if (modules_[i].second.empty())
        printf(".module '%s'\n", modules_[i].first.c_str());
      else
        printf(".module '%s' from '%s'\n", modules_[i].first.c_str(),
               modules_[i].second.c_str());
    }
  }

  if (!nativeFunctionSignatures_.empty()) {
    printf("\n; External Functions\n");
    for (size_t i = 0, e = nativeFunctionSignatures_.size(); i != e; ++i) {
      printf(".extern function %3zu = %-20s\n", i,
             nativeFunctionSignatures_[i].c_str());
    }
  }

  if (!nativeHandlerSignatures_.empty()) {
    printf("\n; External Handlers\n");
    for (size_t i = 0, e = nativeHandlerSignatures_.size(); i != e; ++i) {
      printf(".extern handler %4zu = %-20s\n", i,
             nativeHandlerSignatures_[i].c_str());
    }
  }

  if (!numbers_.empty()) {
    printf("\n; Integer Constants\n");
    for (size_t i = 0, e = numbers_.size(); i != e; ++i) {
      printf(".const integer %5zu = %" PRIi64 "\n", i, (FlowNumber)numbers_[i]);
    }
  }

  if (!strings_.empty()) {
    printf("\n; String Constants\n");
    for (size_t i = 0, e = strings_.size(); i != e; ++i) {
      printf(".const string %6zu = '%s'\n", i, strings_[i].c_str());
    }
  }

  if (!ipaddrs_.empty()) {
    printf("\n; IP Constants\n");
    for (size_t i = 0, e = ipaddrs_.size(); i != e; ++i) {
      printf(".const ipaddr %6zu = %s\n", i, ipaddrs_[i].str().c_str());
    }
  }

  if (!cidrs_.empty()) {
    printf("\n; CIDR Constants\n");
    for (size_t i = 0, e = cidrs_.size(); i != e; ++i) {
      printf(".const cidr %8zu = %s\n", i, cidrs_[i].str().c_str());
    }
  }

  if (!regularExpressions_.empty()) {
    printf("\n; Regular Expression Constants\n");
    for (size_t i = 0, e = regularExpressions_.size(); i != e; ++i) {
      printf(".const regex %7zu = /%s/\n", i, regularExpressions_[i].c_str());
    }
  }

  if (!stringArrays_.empty()) {
    std::cout << "\n; Constant String Arrays\n";
    for (size_t i = 0, e = stringArrays_.size(); i != e; ++i) {
      const std::vector<std::string>& array = stringArrays_[i];
      std::cout << ".const array<string> " << std::setw(3) << i << " = [";
      for (size_t k = 0, m = array.size(); k != m; ++k) {
        if (k) std::cout << ", ";
        std::cout << '"' << array[k] << '"';
      }
      std::cout << "];\n";
    }
  }

  dumpArrays(intArrays_, "Integer");
  dumpArrays(ipaddrArrays_, "IPAddress");
  dumpArrays(cidrArrays_, "Cidr");

  if (!matchDefs_.empty()) { // {{{
    printf("\n; Match Table\n");
    for (size_t i = 0, e = matchDefs_.size(); i != e; ++i) {
      const MatchDef& def = matchDefs_[i];
      printf(".const match %7zu = handler %zu, op %s, elsePC %" PRIu64
             " ; %s\n",
             i, def.handlerId, tos(def.op).c_str(), def.elsePC,
             handlers_[def.handlerId].first.c_str());

      for (size_t k = 0, m = def.cases.size(); k != m; ++k) {
        const MatchCaseDef& one = def.cases[k];

        printf("                       case %3zu = label %2" PRIu64
               ", pc %4" PRIu64 " ; ",
               k, one.label, one.pc);

        if (def.op == MatchClass::RegExp) {
          printf("/%s/\n", regularExpressions_[one.label].c_str());
        } else {
          printf("'%s'\n", strings_[one.label].c_str());
        }
      }
    }
  } // }}}

  for (const auto& handler: getHandlers()) {
    const auto& name = handler.first;
    const auto& code = handler.second;

    printf("\n.handler %-27s ; (%zu stack size, %zu instructions)\n",
           name.c_str(),
           computeStackSize(code.data(), code.size()),
           code.size());
    printf("%s", disassemble(code.data(), code.size(), "  ", this).c_str());
  }

  printf("\n\n");
}